

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  ulong uVar5;
  undefined4 extraout_var_00;
  TestTerminator *pTVar6;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  uint local_18;
  uint local_14;
  uint expected_return_value;
  uint default_return_value;
  TEST_MockReturnValueTest_WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
  *this_local;
  
  local_14 = 10;
  local_18 = 0xb;
  _expected_return_value = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_48);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd0))
            ((long *)CONCAT44(extraout_var,iVar1),local_18);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar4 = UtestShell::getCurrent();
  uVar5 = (ulong)local_18;
  SimpleString::SimpleString(&local_58,"");
  pMVar3 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_68);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x118))
                    ((long *)CONCAT44(extraout_var_00,iVar1),local_14);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,uVar5,(ulong)uVar2,
             "LONGS_EQUAL(expected_return_value, mock().actualCall(\"foo\").returnUnsignedIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xf1,pTVar6);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  pUVar4 = UtestShell::getCurrent();
  uVar5 = (ulong)local_18;
  SimpleString::SimpleString(&local_78,"");
  pMVar3 = mock(&local_78,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x16])(pMVar3,(ulong)local_14);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,uVar5,(ulong)uVar2,
             "LONGS_EQUAL(expected_return_value, mock().returnUnsignedIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xf2,pTVar6);
  SimpleString::~SimpleString(&local_78);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    unsigned int default_return_value = 10;
    unsigned int expected_return_value = default_return_value + 1;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);
    LONGS_EQUAL(expected_return_value, mock().actualCall("foo").returnUnsignedIntValueOrDefault(default_return_value));
    LONGS_EQUAL(expected_return_value, mock().returnUnsignedIntValueOrDefault(default_return_value));
}